

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLockLock::UpdateState(ChLinkLockLock *this)

{
  ChQuaternion<double> *q;
  ChQuaternion<double> *qb;
  ChQuaternion<double> *q_00;
  ChMatrixNM<double,_7,_BODY_QDOF> *this_00;
  ChMatrixNM<double,_7,_BODY_QDOF> *this_01;
  ChVectorN<double,_7> *this_02;
  double dVar1;
  double dVar2;
  Scalar SVar3;
  undefined1 auVar4 [16];
  ChMarker *pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Scalar *pSVar22;
  pointer ppCVar23;
  uint uVar24;
  ulong startRow;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ChMatrix33<double> mtemp3;
  ChMatrix33<double> CqxT;
  ChMatrix33<double> m2_Rel_A_dtdt;
  ChMatrix33<double> m2_Rel_A_dt;
  ChGlMatrix34<double> body2Gl;
  ChGlMatrix34<double> body1Gl;
  ulong local_670;
  undefined1 local_628 [16];
  XprTypeNested pMStack_618;
  variable_if_dynamic<long,__1> local_610;
  ChVector<double> *local_5f8;
  ChQuaternion<double> *local_5f0;
  ChQuaternion<double> *local_5e8;
  ChQuaternion<double> local_5e0;
  undefined1 local_5c0 [16];
  XprTypeNested local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  double local_590;
  ChQuaternion<double> *local_588;
  undefined1 local_580 [16];
  ChMatrixNM<double,_7,_BODY_QDOF> *pCStack_570;
  undefined1 auStack_568 [8];
  variable_if_dynamic<long,__1> vStack_560;
  XprTypeNested local_558;
  double local_550;
  XprTypeNested local_548;
  XprTypeNested pMStack_540;
  double local_538;
  XprTypeNested local_530;
  double local_528;
  double local_520;
  undefined1 local_518 [16];
  XprTypeNested local_508;
  ChQuaternion<double> local_4e0;
  ChStarMatrix44<double> local_4c0;
  undefined1 local_440 [32];
  LhsNested LStack_420;
  undefined1 local_418 [16];
  ChMatrix33<double> *local_408;
  ChMatrix33<double> *pCStack_400;
  RhsNested local_3f8;
  Matrix<double,_3,_3,_1,_3,_3> *local_3f0;
  double local_3e8;
  RhsNested local_3e0;
  undefined1 local_3d8 [16];
  Matrix<double,_3,_3,_1,_3,_3> *local_3c8;
  undefined1 local_390 [16];
  ChQuaternion<double> local_380;
  Matrix<double,_3,_3,_1,_3,_3> local_360;
  undefined1 local_310 [16];
  double local_300;
  undefined1 local_2f0 [56];
  undefined8 local_2b8;
  undefined8 local_2b0;
  ChVector<double> local_2a0;
  ChVector<double> local_280;
  ChMatrix33<double> local_260;
  undefined1 local_218 [80];
  undefined8 local_1c8;
  double local_1c0;
  double local_1b8;
  undefined8 local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 local_190;
  undefined1 local_188 [56];
  undefined8 local_150;
  undefined8 local_148;
  ChGlMatrix34<double> local_140;
  ChGlMatrix34<double> local_e0;
  
  LStack_420.m_matrix = (non_const_type)local_440._24_8_;
  local_310._8_8_ = local_310._0_8_;
  pCVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  local_188._0_8_ = 0;
  local_188._24_8_ = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2]
  ;
  auVar33._0_8_ = -(double)local_188._24_8_;
  auVar33._8_4_ = 0;
  auVar33._12_4_ = 0x80000000;
  local_188._8_8_ = vmovlps_avx(auVar33);
  local_188._32_8_ = 0;
  auVar4 = *(undefined1 (*) [16])
            (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data;
  local_188._16_8_ = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1]
  ;
  local_188._48_4_ = auVar4._8_4_;
  local_188._40_8_ = auVar4._0_8_ ^ 0x8000000000000000;
  local_188._52_4_ = auVar4._12_4_ ^ 0x80000000;
  local_150 = vmovlps_avx(auVar4);
  local_148 = 0;
  pCVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  local_218._72_8_ = 0;
  local_1b8 = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  auVar34._0_8_ = -local_1b8;
  auVar34._8_4_ = 0;
  auVar34._12_4_ = 0x80000000;
  local_1c8 = vmovlps_avx(auVar34);
  local_1b0 = 0;
  auVar4 = *(undefined1 (*) [16])
            (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data;
  local_1c0 = (pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_1a8._8_4_ = auVar4._8_4_;
  local_1a8._0_8_ = auVar4._0_8_ ^ 0x8000000000000000;
  local_1a8._12_4_ = auVar4._12_4_ ^ 0x80000000;
  local_198 = vmovlps_avx(auVar4);
  local_190 = 0;
  ChGlMatrix34<double>::ChGlMatrix34
            (&local_e0,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  ChGlMatrix34<double>::ChGlMatrix34
            (&local_140,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  dVar1 = (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data[2];
  q = &(this->deltaC).rot;
  dVar2 = (this->deltaC).pos.m_data[2];
  auVar4 = vsubpd_avx(*(undefined1 (*) [16])
                       (this->super_ChLinkLock).super_ChLinkMarkers.relM.pos.m_data,
                      *(undefined1 (*) [16])(this->deltaC).pos.m_data);
  *(undefined1 (*) [16])(this->relC).pos.m_data = auVar4;
  (this->relC).pos.m_data[2] = dVar1 - dVar2;
  Qconjugate(q);
  qb = &(this->super_ChLinkLock).super_ChLinkMarkers.relM.rot;
  Qcross((ChQuaternion<double> *)&local_4c0,qb);
  ChQuaternion<double>::operator=(&(this->relC).rot,(ChQuaternion<double> *)local_440);
  dVar1 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data[2];
  q_00 = &(this->deltaC_dt).rot;
  dVar2 = (this->deltaC_dt).pos.m_data[2];
  auVar4 = vsubpd_avx(*(undefined1 (*) [16])
                       (this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.pos.m_data,
                      *(undefined1 (*) [16])(this->deltaC_dt).pos.m_data);
  *(undefined1 (*) [16])(this->relC_dt).pos.m_data = auVar4;
  (this->relC_dt).pos.m_data[2] = dVar1 - dVar2;
  Qconjugate(q_00);
  local_5e8 = qb;
  Qcross((ChQuaternion<double> *)local_580,qb);
  Qconjugate(q);
  local_5f0 = &(this->super_ChLinkLock).super_ChLinkMarkers.relM_dt.rot;
  Qcross((ChQuaternion<double> *)&local_260,local_5f0);
  Qadd((ChQuaternion<double> *)&local_4c0,(ChQuaternion<double> *)local_218);
  ChQuaternion<double>::operator=(&(this->relC_dt).rot,(ChQuaternion<double> *)local_440);
  dVar1 = (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data[2];
  local_588 = &(this->deltaC_dtdt).rot;
  dVar2 = (this->deltaC_dtdt).pos.m_data[2];
  auVar4 = vsubpd_avx(*(undefined1 (*) [16])
                       (this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.pos.m_data,
                      *(undefined1 (*) [16])(this->deltaC_dtdt).pos.m_data);
  *(undefined1 (*) [16])(this->relC_dtdt).pos.m_data = auVar4;
  (this->relC_dtdt).pos.m_data[2] = dVar1 - dVar2;
  Qconjugate(local_588);
  Qcross((ChQuaternion<double> *)local_218,qb);
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)&local_360,
         &(this->super_ChLinkLock).super_ChLinkMarkers.relM_dtdt.rot);
  Qadd((ChQuaternion<double> *)local_580,(ChQuaternion<double> *)&local_260);
  Qconjugate(q_00);
  Qcross(&local_5e0,local_5f0);
  Qscale((ChQuaternion<double> *)local_2f0,(ChQuaternion<double> *)local_628,2.0);
  Qadd((ChQuaternion<double> *)&local_4c0,(ChQuaternion<double> *)local_2f0);
  ChQuaternion<double>::operator=(&(this->relC_dtdt).rot,(ChQuaternion<double> *)local_440);
  ChFrameMoving<double>::Compute_Adt
            (&((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>,
             (ChMatrix33<double> *)local_218);
  ChFrameMoving<double>::Compute_Adtdt
            (&((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>,
             &local_260);
  local_5f8 = &(this->super_ChLinkLock).super_ChLinkMarkers.PQw;
  local_4e0.m_data[0] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_5e0.m_data[0] = (double)local_218;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_4e0,local_5f8);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_5e0,
                    (ChVector<double> *)&local_4c0);
  local_380.m_data[0] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>
                ).super_ChFrame<double>.Amatrix;
  local_310._0_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
        super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  ChMatrix33<double>::operator*
            (&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
              coord_dt.pos);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_310,
                    (ChVector<double> *)local_628);
  pCVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar21._8_8_ = local_2f0._8_8_;
  auVar21._0_8_ = local_2f0._0_8_;
  auVar4 = vsubpd_avx(auVar21,*(undefined1 (*) [16])
                               (pCVar5->super_ChFrameMoving<double>).coord_dt.pos.m_data);
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar4._0_8_;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar4._8_8_;
  local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       (double)local_2f0._16_8_ - (pCVar5->super_ChFrameMoving<double>).coord_dt.pos.m_data[2];
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_380,
                    (ChVector<double> *)&local_360);
  (this->super_ChLinkLock).Ct_temp.pos.m_data[0] = (double)local_440._0_8_ + (double)local_580._0_8_
  ;
  (this->super_ChLinkLock).Ct_temp.pos.m_data[1] = (double)local_440._8_8_ + (double)local_580._8_8_
  ;
  (this->super_ChLinkLock).Ct_temp.pos.m_data[2] = (double)local_440._16_8_ + (double)pCStack_570;
  ChVector<double>::operator-=(&(this->super_ChLinkLock).Ct_temp.pos,&(this->deltaC_dt).pos);
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)local_580,&(this->super_ChLinkLock).super_ChLinkMarkers.q_AD);
  Qconjugate(q_00);
  Qcross((ChQuaternion<double> *)local_2f0,local_5e8);
  local_440._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] +
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  local_440._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] +
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  local_440._16_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] +
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  local_440._24_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3] +
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLock).Ct_temp.rot,(ChQuaternion<double> *)local_440);
  local_440._0_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
        super_ChFrame<double>.Amatrix;
  local_440._8_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
        super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_360,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>_>
              *)local_440);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_4c0,local_5f8);
  local_2f0._0_8_ = 0.0;
  this_00 = &(this->super_ChLinkLock).Cq1_temp;
  auVar35._0_8_ = -(double)local_440._16_8_;
  auVar35._8_4_ = 0;
  auVar35._12_4_ = 0x80000000;
  local_2f0._8_8_ = vmovlps_avx(auVar35);
  local_2f0._24_8_ = local_440._16_8_;
  auVar15._8_8_ = local_440._8_8_;
  auVar15._0_8_ = local_440._0_8_;
  local_2f0._32_8_ = 0.0;
  local_2f0._16_8_ = local_440._8_8_;
  local_2f0._40_8_ = local_440._0_8_ ^ 0x8000000000000000;
  local_2f0._48_4_ = (int)local_440._8_8_;
  local_2f0._52_4_ = SUB84(local_440._8_8_,4) ^ 0x80000000;
  local_2b8 = vmovlps_avx(auVar15);
  local_2b0 = 0;
  register0x00001200 = ZEXT816(0) << 0x20;
  local_418._0_8_ = (RhsNested)0x7;
  local_440._0_8_ = this_00;
  local_440._16_8_ = this_00;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_3,_3,_false> *)local_440,&local_360);
  this_01 = &(this->super_ChLinkLock).Cq2_temp;
  stack0xfffffffffffffbd8 = ZEXT816(0);
  local_418._0_8_ = (RhsNested)0x7;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0] = (double)&local_360;
  local_440._0_8_ = this_01;
  local_440._16_8_ = this_01;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,3,3,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>>
            ((Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_3,_3,_false> *)local_440,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>
              *)&local_4c0);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[3] = (double)local_188;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[4] = (double)&local_e0;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[2] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
                super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0] = (double)&local_360;
  Eigen::DenseBase<Eigen::Matrix<double,7,7,1,7,7>>::topRightCorner<3,4>((Type *)local_440,this_00);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,3,4,false>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,0>>
            ((Type *)local_440,
             (Product<Eigen::Product<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>
              *)&local_4c0);
  local_440._16_8_ = local_218 + 0x48;
  local_418._8_8_ = &local_140;
  local_440._8_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
        super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_418._0_8_ = local_2f0;
  LStack_420.m_matrix =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
        super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>;
  local_440._24_8_ = local_418._8_8_;
  local_440._0_8_ = &local_360;
  Eigen::DenseBase<Eigen::Matrix<double,7,7,1,7,7>>::topRightCorner<3,4>((Type *)&local_4c0,this_01)
  ;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,3,4,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,0>const,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,4,1,3,4>,0>const>>
            ((Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_3,_4,_false> *)&local_4c0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>_>
              *)local_440);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  Qcross((ChQuaternion<double> *)local_580,(ChQuaternion<double> *)local_628);
  auVar11._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar11._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1];
  auVar39._0_8_ =
       (RhsNested)
       ((ulong)local_4c0.super_ChMatrix44<double>.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
               [1] ^ 0x8000000000000000);
  auVar39._8_8_ =
       (XprTypeNested)
       ((ulong)local_4c0.super_ChMatrix44<double>.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
               [2] ^ 0x8000000000000000);
  auVar45._0_8_ =
       (ulong)local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
       ^ 0x8000000000000000;
  auVar45._8_8_ = 0x8000000000000000;
  local_440._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  unique0x00106900 = vunpcklpd_avx(auVar45,auVar11);
  local_3d8 = vshufpd_avx(auVar39,auVar11,1);
  local_418._8_8_ = vmovlpd_avx(auVar45);
  local_418._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  local_408 = (ChMatrix33<double> *)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2]
  ;
  pCStack_400 = (ChMatrix33<double> *)
                local_4c0.super_ChMatrix44<double>.
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
                [2];
  local_3f8 = (RhsNested)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
  ;
  local_3f0 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_3e8 = (double)vmovlpd_avx(auVar39);
  local_3e0 = (RhsNested)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
  ;
  local_3c8 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_440._8_8_ = auVar39._0_8_;
  local_440._16_8_ = auVar39._8_8_;
  ChStarMatrix44<double>::ChStarMatrix44
            (&local_4c0,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  Qconjugate(q);
  auVar7._8_8_ = pMStack_618;
  auVar7._0_8_ = local_628._8_8_;
  auVar46._0_8_ = -(double)local_610.m_value;
  auVar46._8_8_ = 0x8000000000000000;
  local_580._8_8_ = -(double)local_628._8_8_;
  pCStack_570 = (ChMatrixNM<double,_7,_BODY_QDOF> *)-(double)pMStack_618;
  local_580._0_8_ = local_628._0_8_;
  _auStack_568 = vunpcklpd_avx(auVar46,auVar7);
  local_518 = vshufpd_avx(register0x00001280,auVar7,1);
  local_558 = (XprTypeNested)local_628._0_8_;
  local_550 = (double)vmovlpd_avx(auVar46);
  local_548 = pMStack_618;
  pMStack_540 = pMStack_618;
  local_538 = (double)local_610.m_value;
  local_530 = (XprTypeNested)local_628._0_8_;
  local_528 = (double)vmovlpd_avx(register0x00001280);
  local_520 = (double)local_610.m_value;
  local_508 = (XprTypeNested)local_628._0_8_;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[6] =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[6];
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[7] =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[7];
  auVar26._0_8_ =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[9];
  auVar26._8_8_ = 0x8000000000000000;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[9] = (double)vmovlpd_avx(auVar26);
  auVar27._0_8_ =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xb];
  auVar27._8_8_ = 0x8000000000000000;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xb] = (double)vmovlpd_avx(auVar27);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xd] =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xd];
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xe] =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0xe];
  local_5e0.m_data[0] = (double)local_580;
  local_5e0.m_data[1] = (double)local_440;
  local_5e0.m_data[2] = (double)&local_4c0;
  Eigen::DenseBase<Eigen::Matrix<double,7,7,1,7,7>>::bottomRightCorner<4,4>
            ((Type *)local_628,this_00);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,4,4,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,1,4,4>,Eigen::Matrix<double,4,4,1,4,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,0>>
            ((Type *)local_628,
             (Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>
              *)&local_5e0);
  Qconjugate(&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.rot);
  auVar12._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar12._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1];
  auVar40._0_8_ =
       (RhsNested)
       ((ulong)local_4c0.super_ChMatrix44<double>.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
               [1] ^ 0x8000000000000000);
  auVar40._8_8_ =
       (XprTypeNested)
       ((ulong)local_4c0.super_ChMatrix44<double>.
               super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
               [2] ^ 0x8000000000000000);
  auVar47._0_8_ =
       (ulong)local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
       ^ 0x8000000000000000;
  auVar47._8_8_ = 0x8000000000000000;
  local_440._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  unique0x00106900 = vunpcklpd_avx(auVar47,auVar12);
  local_3d8 = vshufpd_avx(auVar40,auVar12,1);
  local_418._8_8_ = vmovlpd_avx(auVar47);
  local_418._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  local_408 = (ChMatrix33<double> *)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2]
  ;
  pCStack_400 = (ChMatrix33<double> *)
                local_4c0.super_ChMatrix44<double>.
                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
                [2];
  local_3f8 = (RhsNested)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
  ;
  local_3f0 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_3e8 = (double)vmovlpd_avx(auVar40);
  local_3e0 = (RhsNested)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[3]
  ;
  local_3c8 = (Matrix<double,_3,_3,_1,_3,_3> *)
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0]
  ;
  local_440._8_8_ = auVar40._0_8_;
  local_440._16_8_ = auVar40._8_8_;
  Qcross(&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
          super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot,
         &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
          super_ChFrame<double>.coord.rot);
  auVar6 = stack0xfffffffffffffa88;
  auVar41._0_8_ = (XprTypeNested)((ulong)local_580._8_8_ ^ 0x8000000000000000);
  auVar41._8_4_ = local_580._16_4_;
  auVar41._12_4_ = local_580._20_4_ ^ 0x80000000;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0] = (double)local_580._0_8_;
  local_5c0._8_8_ = 0;
  local_5c0._0_8_ = auStack_568;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[2] = auVar41._8_8_;
  local_5a0._0_8_ = -(double)auStack_568;
  local_5a0._8_4_ = 0;
  local_5a0._12_4_ = 0x80000000;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[3] = (double)vmovlps_avx(local_5a0);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[4] = (double)vmovlps_avx(stack0xfffffffffffffa88);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[5] = (double)local_580._0_8_;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[8] = (double)pCStack_570;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[10] = (double)local_580._0_8_;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xc] = (double)auStack_568;
  local_5b0 = (XprTypeNested)pCStack_570;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xf] = (double)local_580._0_8_;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[1] = (double)auVar41._0_8_;
  Qconjugate(q);
  auVar9._8_8_ = pMStack_618;
  auVar9._0_8_ = local_628._8_8_;
  local_580._8_8_ = -(double)local_628._8_8_;
  register0x00001288 = (int)pMStack_618;
  register0x0000128c = (uint)((ulong)pMStack_618 >> 0x20) ^ 0x80000000;
  auVar48._0_8_ = -(double)local_610.m_value;
  auVar48._8_4_ = 0;
  auVar48._12_4_ = 0x80000000;
  local_580._0_8_ = local_628._0_8_;
  auStack_568 = (undefined1  [8])vmovlps_avx(auVar48);
  vStack_560.m_value = vmovlps_avx(auVar9);
  local_558 = (XprTypeNested)local_628._0_8_;
  local_550 = (double)vmovlps_avx(auVar48);
  local_548 = pMStack_618;
  pMStack_540 = pMStack_618;
  local_538 = (double)local_610.m_value;
  local_530 = (XprTypeNested)local_628._0_8_;
  local_528 = (double)vmovlps_avx(register0x00001280);
  auVar4 = vshufps_avx(register0x00001280,register0x00001280,0x4e);
  local_520 = (double)local_610.m_value;
  local_518._0_8_ = vmovlps_avx(auVar4);
  local_518._8_8_ = vmovlps_avx(auVar9);
  local_508 = (XprTypeNested)local_628._0_8_;
  auVar4 = vshufps_avx(auVar41,auVar41,0x4e);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[6] = (double)local_5c0._0_8_;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[7] = (double)vmovlps_avx(auVar4);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[9] = (double)vmovlps_avx(local_5a0);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xb] = (double)vmovlps_avx(auVar6);
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xd] = (double)local_5b0;
  local_4c0.super_ChMatrix44<double>.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
  m_storage.m_data.array[0xe] = (double)vmovlps_avx(auVar41);
  ChStarMatrix44<double>::semiNegate(&local_4c0);
  local_5e0.m_data[0] = (double)local_580;
  local_5e0.m_data[1] = (double)local_440;
  local_5e0.m_data[2] = (double)&local_4c0;
  Eigen::DenseBase<Eigen::Matrix<double,7,7,1,7,7>>::bottomRightCorner<4,4>
            ((Type *)local_628,this_01);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,4,4,false>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,4,4,1,4,4>,Eigen::Matrix<double,4,4,1,4,4>,0>,Eigen::Matrix<double,4,4,1,4,4>,0>>
            ((Type *)local_628,
             (Product<Eigen::Product<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>,_Eigen::Matrix<double,_4,_4,_1,_4,_4>,_0>
              *)&local_5e0);
  local_5e0.m_data[0] = 0.0;
  local_5e0.m_data[1] = 0.0;
  local_5e0.m_data[2] = 0.0;
  local_5e0.m_data[3] = 0.0;
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)local_440,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)local_580,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  Vcross<double,double>
            ((ChVector<double> *)local_580,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.pos);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_440._0_8_;
  auVar49._8_8_ = local_440._16_8_;
  auVar49._0_8_ = local_440._16_8_;
  auVar16._8_8_ = local_440._16_8_;
  auVar16._0_8_ = local_440._8_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  auVar54._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar54._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar13._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar13._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1];
  pCVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.marker1;
  auVar4 = vunpcklpd_avx(auVar49,auVar36);
  auVar6 = vunpcklpd_avx(auVar54,auVar28);
  auVar50._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] *
       auVar4._0_8_;
  auVar50._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] *
       auVar4._8_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] *
       (double)local_440._8_8_;
  auVar7 = vfmsub231sd_fma(auVar29,auVar36,auVar13);
  dVar1 = (pCVar5->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  auVar4 = vfmsub213pd_fma(auVar6,auVar16,auVar50);
  dVar2 = (pCVar5->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  dVar8 = (pCVar5->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)&local_4c0,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>);
  Vcross<double,double>
            ((ChVector<double> *)&local_4c0,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->super_ChFrameMoving<double>).
              coord_dt.pos);
  local_280.m_data[0] = (double)local_440._0_8_ + (double)local_440._0_8_ + auVar4._0_8_ + dVar2;
  local_280.m_data[1] = (double)local_440._8_8_ + (double)local_440._8_8_ + auVar4._8_8_ + dVar8;
  local_280.m_data[2] = (double)local_440._16_8_ + (double)local_440._16_8_ + auVar7._0_8_ + dVar1;
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)local_440,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)local_580,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  Vcross<double,double>
            ((ChVector<double> *)local_580,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              super_ChFrame<double>.coord.pos);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_440._0_8_;
  auVar51._8_8_ = local_440._16_8_;
  auVar51._0_8_ = local_440._16_8_;
  auVar17._8_8_ = local_440._16_8_;
  auVar17._0_8_ = local_440._8_8_;
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  auVar55._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar55._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar14._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar14._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1];
  pCVar5 = (this->super_ChLinkLock).super_ChLinkMarkers.marker2;
  auVar4 = vunpcklpd_avx(auVar51,auVar37);
  auVar6 = vunpcklpd_avx(auVar55,auVar30);
  auVar52._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1] *
       auVar4._0_8_;
  auVar52._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2] *
       auVar4._8_8_;
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0] *
       (double)local_440._8_8_;
  auVar7 = vfmsub231sd_fma(auVar31,auVar37,auVar14);
  dVar1 = (pCVar5->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[2];
  auVar4 = vfmsub213pd_fma(auVar6,auVar17,auVar52);
  dVar2 = (pCVar5->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[0];
  dVar8 = (pCVar5->super_ChFrameMoving<double>).coord_dtdt.pos.m_data[1];
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)&local_4c0,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  Vcross<double,double>
            ((ChVector<double> *)&local_4c0,
             &(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>).
              coord_dt.pos);
  local_2a0.m_data[0] = (double)local_440._0_8_ + (double)local_440._0_8_ + auVar4._0_8_ + dVar2;
  local_2a0.m_data[1] = (double)local_440._8_8_ + (double)local_440._8_8_ + auVar4._8_8_ + dVar8;
  local_2a0.m_data[2] = (double)local_440._16_8_ + (double)local_440._16_8_ + auVar7._0_8_ + dVar1;
  ChMatrix33<double>::operator*
            (&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1)->
              super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,&local_280);
  ChMatrix33<double>::operator*
            (&(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,&local_2a0);
  local_5b0 = (XprTypeNested)
              ((double)local_440._8_8_ -
              local_4c0.super_ChMatrix44<double>.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1]
              );
  auVar19._8_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar19._0_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar20._8_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar20._0_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [2];
  dVar1 = (double)local_440._16_8_ -
          local_4c0.super_ChMatrix44<double>.
          super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar18._8_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar18._0_8_ =
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [0];
  local_390 = vmovhps_avx(auVar19,local_360.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[4]);
  local_5c0 = vmovhps_avx(auVar18,local_360.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                  m_storage.m_data.array[3]);
  uStack_5a8 = 0;
  auVar7 = vmovhps_avx(auVar20,local_360.
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[5]);
  local_5a0._8_8_ = 0;
  local_5a0._0_8_ =
       (double)local_440._0_8_ -
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[6];
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       (double)local_5b0 *
       local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
       [7];
  auVar4 = vfmadd231sd_fma(auVar56,local_5a0,auVar4);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_360.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                 m_data.array[8];
  auVar4 = vfmadd231sd_fma(auVar4,auVar53,auVar6);
  local_590 = auVar4._0_8_;
  ChFrameMoving<double>::GetWvel_loc
            ((ChVector<double> *)&local_4c0,
             &((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
              super_ChFrameMoving<double>);
  local_440._0_8_ = (LhsNested)0x0;
  auVar38._0_8_ =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  auVar38._8_4_ = 0;
  auVar38._12_4_ = 0x80000000;
  local_440._8_8_ = vmovlps_avx(auVar38);
  auVar10._8_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1];
  auVar10._0_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  LStack_420.m_matrix = (non_const_type)0x0;
  local_440._24_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[2];
  local_440._16_8_ =
       local_4c0.super_ChMatrix44<double>.
       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1];
  local_418._0_8_ =
       -local_4c0.super_ChMatrix44<double>.
        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[0];
  local_418._8_4_ =
       SUB84(local_4c0.super_ChMatrix44<double>.
             super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array[1],
             0);
  local_418._12_4_ =
       (uint)((ulong)local_4c0.super_ChMatrix44<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
                     array[1] >> 0x20) ^ 0x80000000;
  local_408 = (ChMatrix33<double> *)vmovlps_avx(auVar10);
  pCStack_400 = (ChMatrix33<double> *)0x0;
  local_580._0_8_ =
       &(((this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2)->
        super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix;
  local_580._8_8_ = (ChMatrixNM<double,_7,_BODY_QDOF> *)local_440;
  pCStack_570 = (ChMatrixNM<double,_7,_BODY_QDOF> *)local_440;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_4c0,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)local_580);
  local_4e0.m_data[0] =
       (double)&(((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->super_ChFrameMoving<double>
                ).super_ChFrame<double>.Amatrix;
  local_380.m_data[0] = (double)&local_4c0;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_380,local_5f8);
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_4e0,
                    (ChVector<double> *)local_628);
  auVar44._8_8_ = local_5a0._0_8_;
  auVar44._0_8_ = local_5a0._0_8_;
  auVar42._0_8_ = (double)local_5b0 * (double)local_390._0_8_;
  auVar42._8_8_ = (double)local_5b0 * (double)local_390._8_8_;
  auVar4 = vfmadd132pd_fma(auVar44,auVar42,local_5c0);
  auVar43._8_8_ = dVar1;
  auVar43._0_8_ = dVar1;
  auVar4 = vfmadd132pd_fma(auVar43,auVar4,auVar7);
  local_2a0.m_data[0] = (double)local_580._0_8_;
  local_2a0.m_data[1] = (double)local_580._8_8_;
  local_2a0.m_data[2] = (double)pCStack_570;
  local_300 = ((double)pCStack_570 + local_590 +
              (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[2]) -
              (this->deltaC_dtdt).pos.m_data[2];
  auVar32._0_8_ =
       (double)local_580._0_8_ + auVar4._0_8_ +
       (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[0];
  auVar32._8_8_ =
       (double)local_580._8_8_ + auVar4._8_8_ +
       (this->super_ChLinkLock).super_ChLinkMarkers.q_4.m_data[1];
  local_310 = vsubpd_avx(auVar32,*(undefined1 (*) [16])(this->deltaC_dtdt).pos.m_data);
  Qconjugate(q);
  Qcross((ChQuaternion<double> *)local_628,&(this->super_ChLinkLock).super_ChLinkMarkers.q_8);
  local_5e0.m_data[0] = (double)local_580._0_8_;
  local_5e0.m_data[1] = (double)local_580._8_8_;
  local_5e0.m_data[2] = (double)pCStack_570;
  local_5e0.m_data[3] = (double)auStack_568;
  Qconjugate(q_00);
  Qcross(&local_380,local_5f0);
  Qscale((ChQuaternion<double> *)local_628,&local_4e0,2.0);
  Qadd(&local_5e0,(ChQuaternion<double> *)local_628);
  local_5e0.m_data[0] = (double)local_580._0_8_;
  local_5e0.m_data[1] = (double)local_580._8_8_;
  local_5e0.m_data[2] = (double)pCStack_570;
  local_5e0.m_data[3] = (double)auStack_568;
  Qconjugate(local_588);
  Qcross(&local_4e0,local_5e8);
  Qadd(&local_5e0,(ChQuaternion<double> *)local_628);
  this_02 = &(this->super_ChLinkLock).Qc_temp;
  local_5e0.m_data[0] = (double)local_580._0_8_;
  local_5e0.m_data[1] = (double)local_580._8_8_;
  local_5e0.m_data[2] = (double)pCStack_570;
  local_5e0.m_data[3] = (double)auStack_568;
  local_628._0_8_ = local_310;
  Eigen::VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1> *)local_580,this_02,0,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,1,0,7,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1,_1,_false> *)local_580,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_628);
  local_628._0_8_ = &local_5e0;
  Eigen::VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,_-1>::VectorBlock
            ((VectorBlock<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1> *)local_580,this_02,3,4);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,7,1,0,7,1>,_1,1,false>,Eigen::Map<Eigen::Matrix<double,4,1,0,4,1>,0,Eigen::Stride<0,0>>>
            ((Block<Eigen::Matrix<double,_7,_1,_0,_7,_1>,__1,_1,_false> *)local_580,
             (Map<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0,_Eigen::Stride<0,_0>_> *)local_628);
  local_580._0_8_ = &DAT_bff0000000000000;
  Eigen::DenseBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_> *)this_02,(Scalar *)local_580);
  ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
             super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  bVar25 = ((*ppCVar23)->super_ChConstraintTwo).super_ChConstraint.active == true;
  if (bVar25) {
    pCStack_570 = this_00;
    _auStack_568 = ZEXT816(0);
    local_558 = (XprTypeNested)0x7;
    local_580._0_8_ = this_00;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_7,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               &(this->super_ChLinkLock).Cq1,0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>,1,7,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,1,7,false>>
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               (Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_7,_false> *)local_580);
    auStack_568 = (undefined1  [8])0x0;
    vStack_560.m_value = 0;
    local_558 = (XprTypeNested)0x7;
    local_580._0_8_ = this_01;
    pCStack_570 = this_01;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_7,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               &(this->super_ChLinkLock).Cq2,0,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>,1,7,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,1,7,false>>
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               (Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_7,_false> *)local_580);
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,0);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).pos.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,0);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).pos.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,0);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).pos.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,0);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.pos.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,0);
    *pSVar22 = SVar3;
    ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  local_670 = (ulong)bVar25;
  if ((ppCVar23[1]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    local_580._0_8_ =
         (this->super_ChLinkLock).Cq1_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 7;
    pCStack_570 = this_00;
    _auStack_568 = ZEXT816(1);
    local_558 = (XprTypeNested)0x7;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_7,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               &(this->super_ChLinkLock).Cq1,local_670,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>,1,7,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,1,7,false>>
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               (Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_7,_false> *)local_580);
    local_580._0_8_ =
         (this->super_ChLinkLock).Cq2_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 7;
    auStack_568 = (undefined1  [8])0x1;
    vStack_560.m_value = 0;
    local_558 = (XprTypeNested)0x7;
    pCStack_570 = this_01;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_7,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               &(this->super_ChLinkLock).Cq2,local_670,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>,1,7,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,1,7,false>>
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               (Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_7,_false> *)local_580);
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).pos.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).pos.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).pos.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.pos.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,local_670);
    local_670 = (ulong)(bVar25 + 1);
    *pSVar22 = SVar3;
    ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar23[2]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    local_580._0_8_ =
         (this->super_ChLinkLock).Cq1_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 0xe;
    pCStack_570 = this_00;
    _auStack_568 = ZEXT816(2);
    local_558 = (XprTypeNested)0x7;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_7,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               &(this->super_ChLinkLock).Cq1,local_670,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>,1,7,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,1,7,false>>
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               (Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_7,_false> *)local_580);
    local_580._0_8_ =
         (this->super_ChLinkLock).Cq2_temp.
         super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array + 0xe;
    auStack_568 = (undefined1  [8])0x2;
    vStack_560.m_value = 0;
    local_558 = (XprTypeNested)0x7;
    pCStack_570 = this_01;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_7,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               &(this->super_ChLinkLock).Cq2,local_670,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,7,1,7,7>,1,7,false>,Eigen::Block<Eigen::Matrix<double,7,7,1,7,7>,1,7,false>>
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_7,_false> *)local_628,
               (Block<Eigen::Matrix<double,_7,_7,_1,_7,_7>,_1,_7,_false> *)local_580);
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).pos.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).pos.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).pos.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.pos.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,local_670);
    local_670 = (ulong)((int)local_670 + 1);
    *pSVar22 = SVar3;
    ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar23[3]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq1,local_670,3);
    dVar1 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x19];
    dVar2 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x1a];
    dVar8 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x1b];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq1_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x18];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq2,local_670,3);
    dVar1 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x19];
    dVar2 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x1a];
    dVar8 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x1b];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x18];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[3];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).rot.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).rot.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).rot.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.rot.m_data[0];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,local_670);
    local_670 = (ulong)((int)local_670 + 1);
    *pSVar22 = SVar3;
    ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar23[4]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq1,local_670,3);
    dVar1 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x20];
    dVar2 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x21];
    dVar8 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x22];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq1_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x1f];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq2,local_670,3);
    dVar1 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x20];
    dVar2 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x21];
    dVar8 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x22];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x1f];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[4];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).rot.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).rot.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).rot.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.rot.m_data[1];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,local_670);
    local_670 = (ulong)((int)local_670 + 1);
    *pSVar22 = SVar3;
    ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar24 = (uint)local_670;
  if ((ppCVar23[5]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq1,local_670,3);
    dVar1 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x27];
    dVar2 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x28];
    dVar8 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x29];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq1_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x26];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq2,local_670,3);
    dVar1 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x27];
    dVar2 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x28];
    dVar8 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x29];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x26];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[5];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).rot.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).rot.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).rot.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,local_670);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.rot.m_data[2];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,local_670);
    uVar24 = uVar24 + 1;
    *pSVar22 = SVar3;
    ppCVar23 = (this->super_ChLinkLock).mask.super_ChLinkMask.constraints.
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((ppCVar23[6]->super_ChConstraintTwo).super_ChConstraint.active == true) {
    startRow = (ulong)uVar24;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq1,startRow,3);
    dVar1 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x2e];
    dVar2 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x2f];
    dVar8 = (this->super_ChLinkLock).Cq1_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x30];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq1_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x2d];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    Eigen::Block<Eigen::Matrix<double,_-1,_7,_1,_7,_7>,_1,_4,_false>::Block
              ((Block<Eigen::Matrix<double,__1,_7,_1,_7,_7>,_1,_4,_false> *)local_580,
               &(this->super_ChLinkLock).Cq2,startRow,3);
    dVar1 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x2e];
    dVar2 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x2f];
    dVar8 = (this->super_ChLinkLock).Cq2_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
            [0x30];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[0] = (this->super_ChLinkLock).Cq2_temp.
               super_PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_>.m_storage.m_data.array
               [0x2d];
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[1] = dVar1;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[2] = dVar2;
    (((PlainObjectBase<Eigen::Matrix<double,_7,_7,_1,_7,_7>_> *)local_580._0_8_)->m_storage).m_data.
    array[3] = dVar8;
    SVar3 = (this->super_ChLinkLock).Qc_temp.
            super_PlainObjectBase<Eigen::Matrix<double,_7,_1,_0,_7,_1>_>.m_storage.m_data.array[6];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Qc,startRow);
    *pSVar22 = SVar3;
    SVar3 = (this->relC).rot.m_data[3];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C,startRow);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dt).rot.m_data[3];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dt,startRow);
    *pSVar22 = SVar3;
    SVar3 = (this->relC_dtdt).rot.m_data[3];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).C_dtdt,startRow);
    *pSVar22 = SVar3;
    SVar3 = (this->super_ChLinkLock).Ct_temp.rot.m_data[3];
    pSVar22 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_7,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_7,_1>,_1> *)
                         &(this->super_ChLinkLock).Ct,startRow);
    *pSVar22 = SVar3;
  }
  return;
}

Assistant:

void ChLinkLockLock::UpdateState() {
    // ----------- SOME PRECALCULATED VARIABLES, to optimize speed

    ChStarMatrix33<> P1star(marker1->GetCoord().pos);  // [P] star matrix of rel pos of mark1
    ChStarMatrix33<> Q2star(marker2->GetCoord().pos);  // [Q] star matrix of rel pos of mark2

    ChGlMatrix34<> body1Gl(Body1->GetCoord().rot);
    ChGlMatrix34<> body2Gl(Body2->GetCoord().rot);

    // ----------- RELATIVE LINK-LOCK COORDINATES (violations)

    // relC.pos
    relC.pos = Vsub(relM.pos, deltaC.pos);

    // relC.rot
    relC.rot = Qcross(Qconjugate(deltaC.rot), relM.rot);

    // relC_dt.pos
    relC_dt.pos = Vsub(relM_dt.pos, deltaC_dt.pos);

    // relC_dt.rot
    relC_dt.rot = Qadd(Qcross(Qconjugate(deltaC_dt.rot), relM.rot), Qcross(Qconjugate(deltaC.rot), relM_dt.rot));

    // relC_dtdt.pos
    relC_dtdt.pos = Vsub(relM_dtdt.pos, deltaC_dtdt.pos);

    // relC_dtdt.rot
    relC_dtdt.rot =
        Qadd(Qadd(Qcross(Qconjugate(deltaC_dtdt.rot), relM.rot), Qcross(Qconjugate(deltaC.rot), relM_dtdt.rot)),
             Qscale(Qcross(Qconjugate(deltaC_dt.rot), relM_dt.rot), 2));

    // Compute the Cq Ct Qc matrices (temporary, for complete lock constraint)

    ChMatrix33<> m2_Rel_A_dt;
    marker2->Compute_Adt(m2_Rel_A_dt);
    ChMatrix33<> m2_Rel_A_dtdt;
    marker2->Compute_Adtdt(m2_Rel_A_dtdt);

    // ----------- PARTIAL DERIVATIVE Ct OF CONSTRAINT
    Ct_temp.pos =
        m2_Rel_A_dt.transpose() * (Body2->GetA().transpose() * PQw) +
        marker2->GetA().transpose() *
            (Body2->GetA().transpose() * (Body1->GetA() * marker1->GetCoord_dt().pos) - marker2->GetCoord_dt().pos);
    Ct_temp.pos -= deltaC_dt.pos;  // the deltaC contribute

    // deltaC^*(q_AD) + deltaC_dt^*q_pq
    Ct_temp.rot = Qcross(Qconjugate(deltaC.rot), q_AD) + Qcross(Qconjugate(deltaC_dt.rot), relM.rot);

    //------------ COMPLETE JACOBIANS Cq1_temp AND Cq2_temp AND Qc_temp VECTOR.
    // [Cq_temp]= [[CqxT] [CqxR]]     {Qc_temp} ={[Qcx]}
    //            [[ 0  ] [CqrR]]                {[Qcr]}

    //  JACOBIANS Cq1_temp, Cq2_temp:

    ChMatrix33<> CqxT = marker2->GetA().transpose() * Body2->GetA().transpose();  // [CqxT]=[Aq]'[Ao2]'
    ChStarMatrix33<> tmpStar(Body2->GetA().transpose() * PQw);

    Cq1_temp.topLeftCorner<3, 3>() = CqxT;                                              // *- -- Cq1_temp(1-3)  =[Aqo2]
    Cq2_temp.topLeftCorner<3, 3>() = -CqxT;                                             // -- *- Cq2_temp(1-3)  =-[Aqo2]
    Cq1_temp.topRightCorner<3, 4>() = -CqxT * Body1->GetA() * P1star * body1Gl;         // -* -- Cq1_temp(4-7)
    Cq2_temp.topRightCorner<3, 4>() = CqxT * Body2->GetA() * Q2star * body2Gl +         //
                                      marker2->GetA().transpose() * tmpStar * body2Gl;  // -- -* Cq2_temp(4-7)

    {
        ChStarMatrix44<> stempQ1(Qcross(Qconjugate(marker2->GetCoord().rot), Qconjugate(Body2->GetCoord().rot)));
        ChStarMatrix44<> stempQ2(marker1->GetCoord().rot);
        ChStarMatrix44<> stempDC(Qconjugate(deltaC.rot));
        stempQ2.semiTranspose();
        Cq1_temp.bottomRightCorner<4, 4>() = stempDC * stempQ1 * stempQ2;  // =* == Cq1_temp(col 4-7, row 4-7) ... CqrR
    }

    {
        ChStarMatrix44<> stempQ1(Qconjugate(marker2->GetCoord().rot));
        ChStarMatrix44<> stempQ2(Qcross(Body1->GetCoord().rot, marker1->GetCoord().rot));
        ChStarMatrix44<> stempDC(Qconjugate(deltaC.rot));
        stempQ2.semiTranspose();
        stempQ2.semiNegate();
        Cq2_temp.bottomRightCorner<4, 4>() = stempDC * stempQ1 * stempQ2;  // == =* Cq2_temp(col 4-7, row 4-7) ... CqrR
    }

    //--------- COMPLETE Qc VECTOR
    ChVector<> Qcx;
    ChQuaternion<> Qcr;
    ChVector<> vtemp1;
    ChVector<> vtemp2;

    vtemp1 = Vcross(Body1->GetWvel_loc(), Vcross(Body1->GetWvel_loc(), marker1->GetCoord().pos));
    vtemp1 = Vadd(vtemp1, marker1->GetCoord_dtdt().pos);
    vtemp1 = Vadd(vtemp1, Vmul(Vcross(Body1->GetWvel_loc(), marker1->GetCoord_dt().pos), 2));

    vtemp2 = Vcross(Body2->GetWvel_loc(), Vcross(Body2->GetWvel_loc(), marker2->GetCoord().pos));
    vtemp2 = Vadd(vtemp2, marker2->GetCoord_dtdt().pos);
    vtemp2 = Vadd(vtemp2, Vmul(Vcross(Body2->GetWvel_loc(), marker2->GetCoord_dt().pos), 2));

    Qcx = CqxT * (Body1->GetA() * vtemp1 - Body2->GetA() * vtemp2);

    ChStarMatrix33<> mtemp1(Body2->GetWvel_loc());
    ChMatrix33<> mtemp3 = Body2->GetA() * mtemp1 * mtemp1;
    vtemp2 = marker2->GetA().transpose() * (mtemp3.transpose() * PQw);  // [Aq]'[[A2][w2][w2]]'*Qpq,w
    Qcx = Vadd(Qcx, vtemp2);
    Qcx = Vadd(Qcx, q_4);              // [Adtdt]'[A]'q + 2[Adt]'[Adt]'q + 2[Adt]'[A]'qdt + 2[A]'[Adt]'qdt
    Qcx = Vsub(Qcx, deltaC_dtdt.pos);  // ... - deltaC_dtdt

    Qcr = Qcross(Qconjugate(deltaC.rot), q_8);
    Qcr = Qadd(Qcr, Qscale(Qcross(Qconjugate(deltaC_dt.rot), relM_dt.rot), 2));
    Qcr = Qadd(Qcr, Qcross(Qconjugate(deltaC_dtdt.rot), relM.rot));  // = deltaC'*q_8 + 2*deltaC_dt'*q_dt,po +
                                                                     // deltaC_dtdt'*q,po

    Qc_temp.segment(0, 3) = Qcx.eigen();  // * Qc_temp, for all translational coords
    Qc_temp.segment(3, 4) = Qcr.eigen();  // * Qc_temp, for all rotational coords

    // *** NOTE! The definitive  Qc must change sign, to be used in
    // lagrangian equation:    [Cq]*q_dtdt = Qc
    // because until now we have computed it as [Cq]*q_dtdt + "Qc" = 0,
    // but the most used form is the previous, so let's change sign!!
    Qc_temp *= -1;

    // ---------------------
    // Updates Cq1, Cq2, Qc,
    // C, C_dt, C_dtdt, Ct.
    // ---------------------
    int index = 0;

    if (mask.Constr_X().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(0, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(0, 0);

        Qc(index) = Qc_temp(0);

        C(index) = relC.pos.x();
        C_dt(index) = relC_dt.pos.x();
        C_dtdt(index) = relC_dtdt.pos.x();

        Ct(index) = Ct_temp.pos.x();

        index++;
    }

    if (mask.Constr_Y().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(1, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(1, 0);

        Qc(index) = Qc_temp(1);

        C(index) = relC.pos.y();
        C_dt(index) = relC_dt.pos.y();
        C_dtdt(index) = relC_dtdt.pos.y();

        Ct(index) = Ct_temp.pos.y();

        index++;
    }

    if (mask.Constr_Z().IsActive()) {
        Cq1.block<1, 7>(index, 0) = Cq1_temp.block<1, 7>(2, 0);
        Cq2.block<1, 7>(index, 0) = Cq2_temp.block<1, 7>(2, 0);

        Qc(index) = Qc_temp(2);

        C(index) = relC.pos.z();
        C_dt(index) = relC_dt.pos.z();
        C_dtdt(index) = relC_dtdt.pos.z();

        Ct(index) = Ct_temp.pos.z();

        index++;
    }

    if (mask.Constr_E0().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(3, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(3, 3);

        Qc(index) = Qc_temp(3);

        C(index) = relC.rot.e0();
        C_dt(index) = relC_dt.rot.e0();
        C_dtdt(index) = relC_dtdt.rot.e0();

        Ct(index) = Ct_temp.rot.e0();

        index++;
    }

    if (mask.Constr_E1().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(4, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(4, 3);

        Qc(index) = Qc_temp(4);

        C(index) = relC.rot.e1();
        C_dt(index) = relC_dt.rot.e1();
        C_dtdt(index) = relC_dtdt.rot.e1();

        Ct(index) = Ct_temp.rot.e1();

        index++;
    }

    if (mask.Constr_E2().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(5, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(5, 3);

        Qc(index) = Qc_temp(5);

        C(index) = relC.rot.e2();
        C_dt(index) = relC_dt.rot.e2();
        C_dtdt(index) = relC_dtdt.rot.e2();

        Ct(index) = Ct_temp.rot.e2();

        index++;
    }

    if (mask.Constr_E3().IsActive()) {
        Cq1.block<1, 4>(index, 3) = Cq1_temp.block<1, 4>(6, 3);
        Cq2.block<1, 4>(index, 3) = Cq2_temp.block<1, 4>(6, 3);

        Qc(index) = Qc_temp(6);

        C(index) = relC.rot.e3();
        C_dt(index) = relC_dt.rot.e3();
        C_dtdt(index) = relC_dtdt.rot.e3();

        Ct(index) = Ct_temp.rot.e3();

        index++;
    }
}